

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::writeGroup(SonarQubeReporter *this,TestGroupNode *groupNode)

{
  pointer psVar1;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var2;
  pointer __x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>_>
  testsPerFile;
  allocator<char> local_81;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (groupNode->children).
        super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (groupNode->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__x != psVar1) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 (((((__x->
                     super___shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->value).testInfo)->lineInfo).file,&local_81);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>_>
                              *)&local_60,&local_80);
      std::
      vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
      ::push_back(this_00,__x);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      __x = __x + 1;
    } while (__x != psVar1);
  }
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    writeTestFile(this,(string *)(p_Var2 + 1),(ChildNodes *)(p_Var2 + 2));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void SonarQubeReporter::writeGroup(TestGroupNode const &groupNode) {
        std::map<std::string, TestGroupNode::ChildNodes> testsPerFile;
        for (auto const &child : groupNode.children)
            testsPerFile[child->value.testInfo->lineInfo.file].push_back(child);

        for (auto const &kv : testsPerFile)
            writeTestFile(kv.first, kv.second);
    }